

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O2

Bmc_Mna_t * Bmc_MnaAlloc(void)

{
  Bmc_Mna_t *pBVar1;
  Vec_Int_t *pVVar2;
  sat_solver *s;
  abctime aVar3;
  
  pBVar1 = (Bmc_Mna_t *)calloc(1,0x50);
  pVVar2 = Vec_IntAlloc(0);
  pBVar1->vId2Var = pVVar2;
  pVVar2 = Vec_IntAlloc(1000);
  pBVar1->vInputs = pVVar2;
  pVVar2 = Vec_IntAlloc(1000);
  pBVar1->vOutputs = pVVar2;
  pVVar2 = Vec_IntAlloc(10000);
  pBVar1->vNodes = pVVar2;
  s = sat_solver_new();
  pBVar1->pSat = s;
  pBVar1->nSatVars = 1;
  aVar3 = Abc_Clock();
  pBVar1->clkStart = aVar3;
  sat_solver_setnvars(s,1000);
  return pBVar1;
}

Assistant:

Bmc_Mna_t * Bmc_MnaAlloc()
{
    Bmc_Mna_t * p;
    p = ABC_CALLOC( Bmc_Mna_t, 1 );
    p->vId2Var   = Vec_IntAlloc( 0 );
    p->vInputs   = Vec_IntAlloc( 1000 );
    p->vOutputs  = Vec_IntAlloc( 1000 );
    p->vNodes    = Vec_IntAlloc( 10000 );
    p->pSat      = sat_solver_new();
    p->nSatVars  = 1;
    p->clkStart  = Abc_Clock();
    sat_solver_setnvars( p->pSat, 1000 );
    return p;
}